

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessBlock
          (PeerManagerImpl *this,CNode *node,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked)

{
  time_point tVar1;
  ulong extraout_RDX;
  long in_FS_OFFSET;
  optional<long> from_peer;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  pVar2;
  bool new_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock73;
  bool local_59;
  unique_lock<std::recursive_mutex> local_58;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = false;
  ChainstateManager::ProcessNewBlock
            (this->m_chainman,block,force_processing,min_pow_checked,&local_59);
  if (local_59 == true) {
    tVar1 = NodeClock::now();
    LOCK();
    (node->m_last_block_time)._M_i.__r = (long)tVar1.__d.__r / 1000000000;
    UNLOCK();
    local_58._M_device = &cs_main.super_recursive_mutex;
    local_58._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_58);
    CBlockHeader::GetHash
              (&local_48,
               &((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = 0;
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = extraout_RDX;
    RemoveBlockRequest(this,&local_48,from_peer);
  }
  else {
    local_58._M_device = &cs_main.super_recursive_mutex;
    local_58._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_58);
    CBlockHeader::GetHash
              (&local_48,
               &((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    pVar2 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
            ::equal_range(&(this->mapBlockSource)._M_t,&local_48);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
    ::_M_erase_aux(&(this->mapBlockSource)._M_t,(_Base_ptr)pVar2.first._M_node,
                   (_Base_ptr)pVar2.second._M_node);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessBlock(CNode& node, const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked)
{
    bool new_block{false};
    m_chainman.ProcessNewBlock(block, force_processing, min_pow_checked, &new_block);
    if (new_block) {
        node.m_last_block_time = GetTime<std::chrono::seconds>();
        // In case this block came from a different peer than we requested
        // from, we can erase the block request now anyway (as we just stored
        // this block to disk).
        LOCK(cs_main);
        RemoveBlockRequest(block->GetHash(), std::nullopt);
    } else {
        LOCK(cs_main);
        mapBlockSource.erase(block->GetHash());
    }
}